

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O2

bool __thiscall
ear::GainCalculatorDirectSpeakersImpl::_isLfeChannel
          (GainCalculatorDirectSpeakersImpl *this,DirectSpeakersTypeMetadata *metadata,
          WarningCB *warning_cb)

{
  __type _Var1;
  byte bVar2;
  reference_const_type pdVar3;
  pointer pbVar4;
  byte bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> speakerLabel;
  string nominalLabel;
  allocator<char> local_de;
  allocator<char> local_dd;
  undefined4 local_dc;
  WarningCB *local_d8;
  DirectSpeakersTypeMetadata *local_d0;
  GainCalculatorDirectSpeakersImpl *local_c8;
  pointer local_c0;
  undefined1 local_b8 [40];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar5 = (metadata->channelFrequency).lowPass.super_type.m_initialized;
  local_c8 = this;
  if ((bool)bVar5 == true) {
    pdVar3 = boost::optional<double>::get(&(metadata->channelFrequency).lowPass);
    if (*pdVar3 <= 200.0) {
      local_dc = (undefined4)CONCAT71((int7)((ulong)pdVar3 >> 8),1);
      if (((metadata->channelFrequency).highPass.super_type.m_initialized & 1U) == 0)
      goto LAB_001479d1;
    }
    bVar5 = (metadata->channelFrequency).lowPass.super_type.m_initialized;
  }
  if (((bVar5 & 1) != 0) || ((metadata->channelFrequency).highPass.super_type.m_initialized == true)
     ) {
    local_b8._0_4_ = FREQ_NOT_LFE;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_b8 + 8),
               "frequency indication present but does not indicate an LFE channel",
               (allocator<char> *)&local_90);
    std::function<void_(const_ear::Warning_&)>::operator()(warning_cb,(Warning *)local_b8);
    std::__cxx11::string::~string((string *)(local_b8 + 8));
  }
  local_dc = 0;
LAB_001479d1:
  local_c0 = (metadata->speakerLabels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = 0;
  local_d8 = warning_cb;
  local_d0 = metadata;
  for (pbVar4 = (metadata->speakerLabels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != local_c0; pbVar4 = pbVar4 + 1)
  {
    std::__cxx11::string::string((string *)local_b8,(string *)pbVar4);
    _nominalSpeakerLabel(&local_90,local_c8,(string *)local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"LFE1",&local_dd);
    _Var1 = std::operator==(&local_90,&local_70);
    bVar2 = 1;
    if (!_Var1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"LFE2",&local_de);
      _Var1 = std::operator==(&local_90,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = _Var1 | bVar5;
    }
    bVar5 = bVar2;
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_b8);
  }
  bVar2 = (byte)local_dc;
  if ((((bVar2 ^ bVar5) & 1) != 0) &&
     ((local_d0->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_d0->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    local_b8._0_4_ = FREQ_SPEAKERLABEL_LFE_MISMATCH;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_b8 + 8),
               "LFE indication from frequency element does not match speakerLabel",
               (allocator<char> *)&local_90);
    std::function<void_(const_ear::Warning_&)>::operator()(local_d8,(Warning *)local_b8);
    std::__cxx11::string::~string((string *)(local_b8 + 8));
  }
  return (bool)(bVar2 & 1 | bVar5);
}

Assistant:

bool GainCalculatorDirectSpeakersImpl::_isLfeChannel(
      const DirectSpeakersTypeMetadata& metadata, const WarningCB& warning_cb) {
    bool has_lfe_freq = (metadata.channelFrequency.lowPass != boost::none &&
                         metadata.channelFrequency.lowPass.get() <= 200 &&
                         metadata.channelFrequency.highPass == boost::none);
    if (!has_lfe_freq && (metadata.channelFrequency.lowPass ||
                          metadata.channelFrequency.highPass))
      warning_cb({Warning::Code::FREQ_NOT_LFE,
                  "frequency indication present but does "
                  "not indicate an LFE channel"});

    bool has_lfe_name = false;
    for (auto speakerLabel : metadata.speakerLabels) {
      std::string nominalLabel = _nominalSpeakerLabel(speakerLabel);
      if (nominalLabel == std::string("LFE1") ||
          nominalLabel == std::string("LFE2")) {
        has_lfe_name = true;
      }
    }

    if (has_lfe_freq != has_lfe_name && metadata.speakerLabels.size())
      warning_cb({Warning::Code::FREQ_SPEAKERLABEL_LFE_MISMATCH,
                  "LFE indication from frequency element does not match "
                  "speakerLabel"});

    return has_lfe_freq || has_lfe_name;
  }